

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

char16 * __thiscall Js::JavascriptString::GetString(JavascriptString *this)

{
  code *pcVar1;
  bool bVar2;
  char16_t **ppcVar3;
  undefined4 *puVar4;
  JavascriptString *this_local;
  
  bVar2 = IsFinalized(this);
  if (!bVar2) {
    (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x65])();
    ppcVar3 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                        ((WriteBarrierPtr *)&this->m_pszValue);
    if (*ppcVar3 == (char16_t *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                  ,0xb23,"(m_pszValue)","m_pszValue");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  ppcVar3 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                      ((WriteBarrierPtr *)&this->m_pszValue);
  return *ppcVar3;
}

Assistant:

const char16 * JavascriptString::GetString()
    {
        if (!this->IsFinalized())
        {
            this->GetSz();
            Assert(m_pszValue);
        }
        return m_pszValue;
    }